

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

char * nifti_makeimgname(char *prefix,int nifti_type,int check,int comp)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  size_t sVar4;
  char extgz [5];
  char extimg [5];
  char exthdr [5];
  char extnia [5];
  char extnii [5];
  
  builtin_strncpy(extnii,".nii",5);
  builtin_strncpy(exthdr,".hdr",5);
  builtin_strncpy(extimg,".img",5);
  builtin_strncpy(extnia,".nia",5);
  extgz[4] = '\0';
  builtin_strncpy(extgz,".gz",4);
  iVar1 = nifti_validfilename(prefix);
  if (iVar1 == 0) {
    return (char *)0x0;
  }
  sVar2 = strlen(prefix);
  __dest = (char *)calloc(1,sVar2 + 8);
  if (__dest == (char *)0x0) {
    fwrite("** small malloc failure!\n",0x19,1,_stderr);
  }
  else {
    strcpy(__dest,prefix);
    pcVar3 = nifti_find_file_extension(__dest);
    if (pcVar3 == (char *)0x0) {
      sVar2 = strlen(__dest);
      if (nifti_type == 3) {
        builtin_strncpy(__dest + sVar2,".nia",5);
      }
      else if (nifti_type == 1) {
        builtin_strncpy(__dest + sVar2,".nii",5);
      }
      else {
        builtin_strncpy(__dest + sVar2,".img",5);
      }
    }
    else {
      iVar1 = is_uppercase(pcVar3);
      if (iVar1 != 0) {
        make_uppercase(extnii);
        make_uppercase(exthdr);
        make_uppercase(extimg);
        make_uppercase(extnia);
        make_uppercase(extgz);
      }
      iVar1 = strncmp(pcVar3,exthdr,4);
      if (iVar1 == 0) {
        sVar2 = strlen(__dest);
        sVar4 = strlen(pcVar3);
        *(undefined4 *)(__dest + (sVar2 - sVar4)) = extimg._0_4_;
      }
    }
    if ((comp != 0) &&
       ((pcVar3 == (char *)0x0 || (pcVar3 = strstr(__dest,extgz), pcVar3 == (char *)0x0)))) {
      strcat(__dest,extgz);
    }
    if ((check == 0) || (iVar1 = nifti_fileexists(__dest), iVar1 == 0)) {
      if (g_opts_0 < 3) {
        return __dest;
      }
      fprintf(_stderr,"+d made image filename \'%s\'\n",__dest);
      return __dest;
    }
    fprintf(_stderr,"** failure: image file \'%s\' already exists\n",__dest);
    free(__dest);
  }
  return (char *)0x0;
}

Assistant:

char * nifti_makeimgname(const char * prefix, int nifti_type, int check,
                         int comp)
{
   char * iname;
   const char * ext;
   char   extnii[5] = ".nii";   /* modifiable, for possible uppercase */
   char   exthdr[5] = ".hdr";
   char   extimg[5] = ".img";
   char   extnia[5] = ".nia";
   char   extgz[5]  = ".gz";

   if( !nifti_validfilename(prefix) ) return NULL;

   /* add space for extension, optional ".gz", and null char */
   iname = (char *)calloc(sizeof(char),strlen(prefix)+8);
   if( !iname ){ fprintf(stderr,"** small malloc failure!\n"); return NULL; }
   strcpy(iname, prefix);

   /* use any valid extension */
   if( (ext = nifti_find_file_extension(iname)) != NULL ){
      /* if uppercase, convert all extensions */
      if( is_uppercase(ext) ) {
         make_uppercase(extnii);
         make_uppercase(exthdr);
         make_uppercase(extimg);
         make_uppercase(extnia);
         make_uppercase(extgz);
      }

      if( strncmp(ext,exthdr,4) == 0 )
      {
         memcpy(&(iname[strlen(iname)-strlen(ext)]),extimg,4);   /* then convert hdr name to img */
      }
   }
   /* otherwise, make one up */
   else if( nifti_type == NIFTI_FTYPE_NIFTI1_1 ) strcat(iname, extnii);
   else if( nifti_type == NIFTI_FTYPE_ASCII )    strcat(iname, extnia);
   else                                          strcat(iname, extimg);

#ifdef HAVE_ZLIB  /* if compression is requested, make sure of suffix */
   if( comp && (!ext || !strstr(iname,extgz)) ) strcat(iname,extgz);
#endif

   /* check for existence failure */
   if( check && nifti_fileexists(iname) ){
      fprintf(stderr,"** failure: image file '%s' already exists\n",iname);
      free(iname);
      return NULL;
   }

   if( g_opts.debug > 2 ) fprintf(stderr,"+d made image filename '%s'\n",iname);

   return iname;
}